

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O2

void duckdb::SortedAggregateFunction::ScatterUpdate
               (Vector *inputs,AggregateInputData *aggr_input_data,idx_t input_count,Vector *states,
               idx_t count)

{
  sel_t *psVar1;
  long lVar2;
  long lVar3;
  SortedAggregateBindData *order_bind;
  reference pvVar4;
  ulong uVar5;
  ulong uVar6;
  pointer puVar7;
  size_type __n;
  idx_t i_1;
  data_ptr_t pdVar8;
  idx_t i_2;
  vector<unsigned_int,_true> sel_data;
  UnifiedVectorFormat svdata;
  DataChunk sort_inputs;
  DataChunk arg_inputs;
  allocator_type local_131;
  idx_t local_130;
  long local_128;
  data_ptr_t local_120;
  AggregateInputData *local_118;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  UnifiedVectorFormat local_f8;
  DataChunk local_b0;
  DataChunk local_70;
  
  if (count != 0) {
    local_130 = count;
    order_bind = (SortedAggregateBindData *)
                 optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
    DataChunk::DataChunk(&local_70);
    DataChunk::DataChunk(&local_b0);
    ProjectInputs(inputs,order_bind,input_count,local_130,&local_70,&local_b0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_f8);
    Vector::ToUnifiedFormat(states,local_130,&local_f8);
    psVar1 = (local_f8.sel)->sel_vector;
    for (uVar6 = 0; local_130 != uVar6; uVar6 = uVar6 + 1) {
      uVar5 = uVar6;
      if (psVar1 != (sel_t *)0x0) {
        uVar5 = (ulong)psVar1[uVar6];
      }
      *(long *)(*(long *)(local_f8.data + uVar5 * 8) + 0x80) =
           *(long *)(*(long *)(local_f8.data + uVar5 * 8) + 0x80) + 1;
    }
    local_118 = aggr_input_data;
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110,local_130,
               &local_131);
    local_128 = 0;
    local_120 = local_f8.data;
    pdVar8 = local_f8.data;
    for (uVar6 = 0; lVar3 = local_128, local_130 != uVar6; uVar6 = uVar6 + 1) {
      uVar5 = uVar6;
      if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)(local_f8.sel)->sel_vector[uVar6];
      }
      lVar2 = *(long *)(pdVar8 + uVar5 * 8);
      __n = *(size_type *)(lVar2 + 0x88);
      if (__n == 0) {
        *(long *)(lVar2 + 0x88) = local_128;
        puVar7 = local_110._M_impl.super__Vector_impl_data._M_start + local_128;
        ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::reset
                  ((__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)(lVar2 + 0x70)
                  );
        *(pointer *)(lVar2 + 0x68) = puVar7;
        local_128 = lVar3 + *(long *)(lVar2 + 0x80);
        __n = *(size_type *)(lVar2 + 0x88);
        pdVar8 = local_120;
      }
      *(size_type *)(lVar2 + 0x88) = __n + 1;
      pvVar4 = vector<unsigned_int,_true>::get<true>((vector<unsigned_int,_true> *)&local_110,__n);
      *pvVar4 = (value_type)uVar5;
    }
    for (uVar6 = 0; local_130 != uVar6; uVar6 = uVar6 + 1) {
      uVar5 = uVar6;
      if ((local_f8.sel)->sel_vector != (sel_t *)0x0) {
        uVar5 = (ulong)(local_f8.sel)->sel_vector[uVar6];
      }
      if ((*(SortedAggregateState **)(pdVar8 + uVar5 * 8))->nsel != 0) {
        SortedAggregateState::UpdateSlice
                  (*(SortedAggregateState **)(pdVar8 + uVar5 * 8),local_118,&local_b0,&local_70);
      }
    }
    ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_110);
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_f8);
    DataChunk::~DataChunk(&local_b0);
    DataChunk::~DataChunk(&local_70);
  }
  return;
}

Assistant:

static void ScatterUpdate(Vector inputs[], AggregateInputData &aggr_input_data, idx_t input_count, Vector &states,
	                          idx_t count) {
		if (!count) {
			return;
		}

		// Append the arguments to the two sub-collections
		const auto &order_bind = aggr_input_data.bind_data->Cast<SortedAggregateBindData>();
		DataChunk arg_inputs;
		DataChunk sort_inputs;
		ProjectInputs(inputs, order_bind, input_count, count, arg_inputs, sort_inputs);

		// We have to scatter the chunks one at a time
		// so build a selection vector for each one.
		UnifiedVectorFormat svdata;
		states.ToUnifiedFormat(count, svdata);

		// Size the selection vector for each state.
		auto sdata = UnifiedVectorFormat::GetDataNoConst<SortedAggregateState *>(svdata);
		for (idx_t i = 0; i < count; ++i) {
			auto sidx = svdata.sel->get_index(i);
			auto order_state = sdata[sidx];
			order_state->nsel++;
		}

		// Build the selection vector for each state.
		vector<sel_t> sel_data(count);
		idx_t start = 0;
		for (idx_t i = 0; i < count; ++i) {
			auto sidx = svdata.sel->get_index(i);
			auto order_state = sdata[sidx];
			if (!order_state->offset) {
				//	First one
				order_state->offset = start;
				order_state->sel.Initialize(sel_data.data() + order_state->offset);
				start += order_state->nsel;
			}
			sel_data[order_state->offset++] = UnsafeNumericCast<sel_t>(sidx);
		}

		// Append nonempty slices to the arguments
		for (idx_t i = 0; i < count; ++i) {
			auto sidx = svdata.sel->get_index(i);
			auto order_state = sdata[sidx];
			if (!order_state->nsel) {
				continue;
			}

			order_state->UpdateSlice(aggr_input_data, sort_inputs, arg_inputs);
		}
	}